

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void glfwSetGammaRamp(GLFWmonitor *handle,GLFWgammaramp *ramp)

{
  GLFWbool GVar1;
  _GLFWmonitor *in_RSI;
  GLFWgammaramp *in_RDI;
  _GLFWmonitor *monitor;
  
  if (*(int *)&in_RSI->window == 0) {
    _glfwInputError(0x10004,"Invalid gamma ramp size %i",(ulong)*(uint *)&in_RSI->window);
  }
  else if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((*(int *)&in_RDI[3].red != 0) ||
          (GVar1 = _glfwPlatformGetGammaRamp((_GLFWmonitor *)ramp,(GLFWgammaramp *)monitor),
          GVar1 != 0)) {
    _glfwPlatformSetGammaRamp(in_RSI,in_RDI);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetGammaRamp(GLFWmonitor* handle, const GLFWgammaramp* ramp)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);
    assert(ramp != NULL);
    assert(ramp->size > 0);
    assert(ramp->red != NULL);
    assert(ramp->green != NULL);
    assert(ramp->blue != NULL);

    if (ramp->size <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid gamma ramp size %i",
                        ramp->size);
        return;
    }

    _GLFW_REQUIRE_INIT();

    if (!monitor->originalRamp.size)
    {
        if (!_glfwPlatformGetGammaRamp(monitor, &monitor->originalRamp))
            return;
    }

    _glfwPlatformSetGammaRamp(monitor, ramp);
}